

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O2

void __thiscall
draco::EncoderOptionsBase<int>::SetSpeed
          (EncoderOptionsBase<int> *this,int encoding_speed,int decoding_speed)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"encoding_speed",&local_39)
  ;
  Options::SetInt((Options *)this,&local_38,encoding_speed);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"decoding_speed",&local_39)
  ;
  Options::SetInt((Options *)this,&local_38,decoding_speed);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SetSpeed(int encoding_speed, int decoding_speed) {
    this->SetGlobalInt("encoding_speed", encoding_speed);
    this->SetGlobalInt("decoding_speed", decoding_speed);
  }